

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,DoStatement *do_stmt,void *data)

{
  pointer pSVar1;
  Guard *in_RDI;
  Guard g;
  anon_class_8_1_8991fb9c *__f;
  function<void_()> *in_stack_ffffffffffffff60;
  function<void_()> *this_00;
  function<void_()> *in_stack_ffffffffffffff68;
  Guard *in_stack_ffffffffffffff70;
  function<void_()> local_80;
  anon_class_8_1_8991fb9c local_58 [11];
  
  __f = local_58;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::DoStatement*,void*)::__0,void>
            (in_stack_ffffffffffffff60,__f);
  this_00 = &local_80;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::DoStatement*,void*)::__1,void>(this_00,__f);
  Guard::Guard(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,this_00);
  std::function<void_()>::~function((function<void_()> *)0x1e2d46);
  std::function<void_()>::~function((function<void_()> *)0x1e2d50);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e2d61);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  Guard::~Guard(in_RDI);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(DoStatement *do_stmt, void *data)
    {
        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
        do_stmt->block_->Accept(this, nullptr);
    }